

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ecdsa_sign_inner
              (secp256k1_context *ctx,secp256k1_scalar *r,secp256k1_scalar *s,int *recid,
              secp256k1_sha256 *s2c_sha,secp256k1_ecdsa_s2c_opening *s2c_opening,uchar *s2c_data32,
              uchar *msg32,uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  secp256k1_scalar *r_00;
  int iVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  uint uVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  uint uVar81;
  void *data_size;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  ulong uVar86;
  ulong uVar87;
  ulong uVar88;
  ulong uVar89;
  ulong uVar90;
  ulong uVar91;
  ulong uVar92;
  uint uVar93;
  code *pcVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  secp256k1_ge_storage s_1;
  int overflow;
  secp256k1_ge nonce_p;
  uchar b [32];
  int local_254;
  secp256k1_context *local_250;
  secp256k1_scalar *local_248;
  uint local_240;
  uint local_23c;
  secp256k1_sha256 *local_238;
  secp256k1_ecdsa_s2c_opening *local_230;
  secp256k1_scalar *local_228;
  secp256k1_nonce_function local_220;
  secp256k1_scalar local_218;
  uchar local_1f8 [32];
  undefined1 local_1d8 [56];
  uint64_t uStack_1a0;
  secp256k1_scalar local_190;
  secp256k1_scalar local_170;
  secp256k1_gej local_150;
  secp256k1_ge local_d0;
  uchar local_78 [40];
  secp256k1_scalar local_50;
  
  r->d[2] = 0;
  r->d[3] = 0;
  r->d[0] = 0;
  r->d[1] = 0;
  s->d[2] = 0;
  s->d[3] = 0;
  s->d[0] = 0;
  s->d[1] = 0;
  if (recid != (int *)0x0) {
    *recid = 0;
  }
  pcVar94 = nonce_function_rfc6979;
  if (noncefp != (secp256k1_nonce_function)0x0) {
    pcVar94 = noncefp;
  }
  local_250 = ctx;
  local_248 = s;
  local_238 = s2c_sha;
  secp256k1_scalar_set_b32(&local_170,seckey,(int *)&local_150);
  local_240 = (uint)(((local_170.d[2] != 0 || local_170.d[3] != 0) ||
                     (local_170.d[1] != 0 || local_170.d[0] != 0)) && (int)local_150.x.n[0] == 0);
  uVar72 = (ulong)(local_240 ^ 1) - 1;
  local_170.d[0] = local_170.d[0] & uVar72 | (ulong)(local_240 ^ 1);
  local_170.d[1] = local_170.d[1] & uVar72;
  local_170.d[2] = local_170.d[2] & uVar72;
  local_170.d[3] = uVar72 & local_170.d[3];
  uVar81 = 0;
  secp256k1_scalar_set_b32(&local_190,msg32,(int *)0x0);
  data_size = noncedata;
  local_220 = pcVar94;
  iVar70 = (*pcVar94)(local_1f8,msg32,seckey,(uchar *)0x0,noncedata,0);
  if (iVar70 != 0) {
    local_250 = (secp256k1_context *)&local_250->ecmult_gen_ctx;
    uVar93 = 1;
    local_230 = s2c_opening;
    local_228 = r;
    do {
      secp256k1_scalar_set_b32(&local_218,local_1f8,(int *)&local_150);
      if (((int)local_150.x.n[0] == 0) &&
         ((local_218.d[3] != 0 || local_218.d[1] != 0) ||
          (local_218.d[2] != 0 || local_218.d[0] != 0))) {
        local_23c = uVar93;
        if (s2c_data32 != (uchar *)0x0) {
          secp256k1_ecmult_gen((secp256k1_ecmult_gen_context *)local_250,&local_150,&local_218);
          secp256k1_ge_set_gej(&local_d0,&local_150);
          if (s2c_opening != (secp256k1_ecdsa_s2c_opening *)0x0) {
            secp256k1_ge_to_storage((secp256k1_ge_storage *)local_1d8,&local_d0);
            *(undefined8 *)(s2c_opening->data + 0x30) = local_1d8._48_8_;
            *(uint64_t *)(s2c_opening->data + 0x38) = uStack_1a0;
            *(undefined8 *)(s2c_opening->data + 0x20) = local_1d8._32_8_;
            *(undefined8 *)(s2c_opening->data + 0x28) = local_1d8._40_8_;
            *(undefined8 *)(s2c_opening->data + 0x10) = local_1d8._16_8_;
            *(undefined8 *)(s2c_opening->data + 0x18) = local_1d8._24_8_;
            *(undefined8 *)s2c_opening->data = local_1d8._0_8_;
            *(undefined8 *)(s2c_opening->data + 8) = local_1d8._8_8_;
          }
          iVar70 = secp256k1_ec_commit_tweak
                             ((uchar *)local_1d8,&local_d0,local_238,s2c_data32,(size_t)data_size);
          if ((iVar70 == 0) ||
             (iVar70 = secp256k1_ec_seckey_tweak_add_helper(&local_218,(uchar *)local_1d8),
             iVar70 == 0)) {
            uVar81 = 0;
            break;
          }
        }
        local_254 = 0;
        secp256k1_ecmult_gen((secp256k1_ecmult_gen_context *)local_250,&local_150,&local_218);
        secp256k1_ge_set_gej(&local_d0,&local_150);
        secp256k1_fe_normalize(&local_d0.x);
        secp256k1_fe_normalize(&local_d0.y);
        secp256k1_fe_get_b32(local_78,&local_d0.x);
        secp256k1_scalar_set_b32(r,local_78,&local_254);
        if (recid != (int *)0x0) {
          *recid = ((uint)local_d0.y.n[0] & 1) + local_254 * 2;
        }
        uVar72 = r->d[0];
        uVar73 = r->d[1];
        uVar74 = r->d[2];
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar72;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = local_170.d[0];
        uVar76 = SUB168(auVar2 * auVar34,8);
        auVar68._8_8_ = 0;
        auVar68._0_8_ = uVar76;
        local_1d8._0_8_ = SUB168(auVar2 * auVar34,0);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar72;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = local_170.d[1];
        auVar3 = auVar3 * auVar35;
        uVar82 = SUB168(auVar3 + auVar68,0);
        uVar87 = SUB168(auVar3 + auVar68,8);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar73;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = local_170.d[0];
        uVar77 = SUB168(auVar4 * auVar36,8);
        uVar71 = SUB168(auVar4 * auVar36,0);
        local_1d8._8_8_ = uVar82 + uVar71;
        uVar71 = (ulong)CARRY8(uVar82,uVar71);
        uVar82 = uVar87 + uVar77;
        uVar88 = uVar82 + uVar71;
        uVar89 = (ulong)CARRY8(auVar3._8_8_,(ulong)CARRY8(uVar76,auVar3._0_8_)) +
                 (ulong)(CARRY8(uVar87,uVar77) || CARRY8(uVar82,uVar71));
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar72;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = local_170.d[2];
        uVar78 = SUB168(auVar5 * auVar37,8);
        uVar71 = SUB168(auVar5 * auVar37,0);
        uVar76 = uVar88 + uVar71;
        uVar71 = (ulong)CARRY8(uVar88,uVar71);
        uVar77 = uVar89 + uVar78;
        uVar90 = uVar77 + uVar71;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar73;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = local_170.d[1];
        uVar79 = SUB168(auVar6 * auVar38,8);
        uVar82 = SUB168(auVar6 * auVar38,0);
        uVar88 = uVar76 + uVar82;
        uVar82 = (ulong)CARRY8(uVar76,uVar82);
        uVar87 = uVar90 + uVar79;
        uVar91 = uVar87 + uVar82;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar74;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = local_170.d[0];
        uVar80 = SUB168(auVar7 * auVar39,8);
        uVar76 = SUB168(auVar7 * auVar39,0);
        local_1d8._16_8_ = uVar88 + uVar76;
        uVar76 = (ulong)CARRY8(uVar88,uVar76);
        uVar88 = uVar91 + uVar80;
        uVar92 = uVar88 + uVar76;
        uVar83 = (ulong)(CARRY8(uVar89,uVar78) || CARRY8(uVar77,uVar71)) +
                 (ulong)(CARRY8(uVar90,uVar79) || CARRY8(uVar87,uVar82)) +
                 (ulong)(CARRY8(uVar91,uVar80) || CARRY8(uVar88,uVar76));
        auVar8._8_8_ = 0;
        auVar8._0_8_ = uVar72;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = local_170.d[3];
        uVar80 = SUB168(auVar8 * auVar40,8);
        uVar72 = SUB168(auVar8 * auVar40,0);
        uVar76 = uVar92 + uVar72;
        uVar71 = (ulong)CARRY8(uVar92,uVar72);
        uVar87 = uVar83 + uVar80;
        uVar92 = uVar87 + uVar71;
        uVar72 = r->d[3];
        auVar9._8_8_ = 0;
        auVar9._0_8_ = uVar73;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = local_170.d[2];
        uVar89 = SUB168(auVar9 * auVar41,8);
        uVar82 = SUB168(auVar9 * auVar41,0);
        uVar77 = uVar76 + uVar82;
        uVar82 = (ulong)CARRY8(uVar76,uVar82);
        uVar88 = uVar92 + uVar89;
        uVar84 = uVar88 + uVar82;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = uVar74;
        auVar42._8_8_ = 0;
        auVar42._0_8_ = local_170.d[1];
        uVar90 = SUB168(auVar10 * auVar42,8);
        uVar76 = SUB168(auVar10 * auVar42,0);
        uVar79 = uVar77 + uVar76;
        uVar76 = (ulong)CARRY8(uVar77,uVar76);
        uVar78 = uVar84 + uVar90;
        uVar85 = uVar78 + uVar76;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = uVar72;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = local_170.d[0];
        uVar91 = SUB168(auVar11 * auVar43,8);
        uVar77 = SUB168(auVar11 * auVar43,0);
        local_1d8._24_8_ = uVar79 + uVar77;
        uVar77 = (ulong)CARRY8(uVar79,uVar77);
        uVar79 = uVar85 + uVar91;
        uVar86 = uVar79 + uVar77;
        uVar80 = (ulong)(CARRY8(uVar83,uVar80) || CARRY8(uVar87,uVar71)) +
                 (ulong)(CARRY8(uVar92,uVar89) || CARRY8(uVar88,uVar82)) +
                 (ulong)(CARRY8(uVar84,uVar90) || CARRY8(uVar78,uVar76)) +
                 (ulong)(CARRY8(uVar85,uVar91) || CARRY8(uVar79,uVar77));
        auVar12._8_8_ = 0;
        auVar12._0_8_ = uVar73;
        auVar44._8_8_ = 0;
        auVar44._0_8_ = local_170.d[3];
        uVar88 = SUB168(auVar12 * auVar44,8);
        uVar73 = SUB168(auVar12 * auVar44,0);
        uVar82 = uVar86 + uVar73;
        uVar73 = (ulong)CARRY8(uVar86,uVar73);
        uVar76 = uVar80 + uVar88;
        uVar89 = uVar76 + uVar73;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = uVar74;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = local_170.d[2];
        uVar78 = SUB168(auVar13 * auVar45,8);
        uVar71 = SUB168(auVar13 * auVar45,0);
        uVar87 = uVar82 + uVar71;
        uVar71 = (ulong)CARRY8(uVar82,uVar71);
        uVar77 = uVar89 + uVar78;
        uVar90 = uVar77 + uVar71;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = uVar72;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = local_170.d[1];
        uVar79 = SUB168(auVar14 * auVar46,8);
        uVar82 = SUB168(auVar14 * auVar46,0);
        local_1d8._32_8_ = uVar87 + uVar82;
        uVar82 = (ulong)CARRY8(uVar87,uVar82);
        uVar87 = uVar90 + uVar79;
        uVar91 = uVar87 + uVar82;
        uVar87 = (ulong)(CARRY8(uVar80,uVar88) || CARRY8(uVar76,uVar73)) +
                 (ulong)(CARRY8(uVar89,uVar78) || CARRY8(uVar77,uVar71)) +
                 (ulong)(CARRY8(uVar90,uVar79) || CARRY8(uVar87,uVar82));
        auVar15._8_8_ = 0;
        auVar15._0_8_ = uVar74;
        auVar47._8_8_ = 0;
        auVar47._0_8_ = local_170.d[3];
        uVar76 = SUB168(auVar15 * auVar47,8);
        uVar73 = SUB168(auVar15 * auVar47,0);
        uVar82 = uVar91 + uVar73;
        uVar73 = (ulong)CARRY8(uVar91,uVar73);
        uVar71 = uVar87 + uVar76;
        uVar88 = uVar71 + uVar73;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = uVar72;
        auVar48._8_8_ = 0;
        auVar48._0_8_ = local_170.d[2];
        uVar77 = SUB168(auVar16 * auVar48,8);
        uVar74 = SUB168(auVar16 * auVar48,0);
        local_1d8._40_8_ = uVar82 + uVar74;
        uVar74 = (ulong)CARRY8(uVar82,uVar74);
        uVar82 = uVar88 + uVar77;
        auVar66._8_8_ =
             (ulong)(CARRY8(uVar87,uVar76) || CARRY8(uVar71,uVar73)) +
             (ulong)(CARRY8(uVar88,uVar77) || CARRY8(uVar82,uVar74));
        auVar66._0_8_ = uVar82 + uVar74;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = uVar72;
        auVar49._8_8_ = 0;
        auVar49._0_8_ = local_170.d[3];
        unique0x100001d9 = auVar17 * auVar49 + auVar66;
        secp256k1_scalar_reduce_512(&local_50,(uint64_t *)local_1d8);
        secp256k1_scalar_add(&local_50,&local_50,&local_190);
        r_00 = local_248;
        secp256k1_scalar_inverse(local_248,&local_218);
        uVar72 = r_00->d[0];
        uVar73 = r_00->d[1];
        uVar74 = r_00->d[2];
        auVar18._8_8_ = 0;
        auVar18._0_8_ = uVar72;
        auVar50._8_8_ = 0;
        auVar50._0_8_ = local_50.d[0];
        uVar76 = SUB168(auVar18 * auVar50,8);
        auVar69._8_8_ = 0;
        auVar69._0_8_ = uVar76;
        local_1d8._0_8_ = SUB168(auVar18 * auVar50,0);
        auVar19._8_8_ = 0;
        auVar19._0_8_ = uVar72;
        auVar51._8_8_ = 0;
        auVar51._0_8_ = local_50.d[1];
        auVar19 = auVar19 * auVar51;
        uVar82 = SUB168(auVar19 + auVar69,0);
        uVar87 = SUB168(auVar19 + auVar69,8);
        auVar20._8_8_ = 0;
        auVar20._0_8_ = uVar73;
        auVar52._8_8_ = 0;
        auVar52._0_8_ = local_50.d[0];
        uVar77 = SUB168(auVar20 * auVar52,8);
        uVar71 = SUB168(auVar20 * auVar52,0);
        local_1d8._8_8_ = uVar82 + uVar71;
        uVar71 = (ulong)CARRY8(uVar82,uVar71);
        uVar82 = uVar87 + uVar77;
        uVar88 = uVar82 + uVar71;
        uVar89 = (ulong)CARRY8(auVar19._8_8_,(ulong)CARRY8(uVar76,auVar19._0_8_)) +
                 (ulong)(CARRY8(uVar87,uVar77) || CARRY8(uVar82,uVar71));
        auVar21._8_8_ = 0;
        auVar21._0_8_ = uVar72;
        auVar53._8_8_ = 0;
        auVar53._0_8_ = local_50.d[2];
        uVar78 = SUB168(auVar21 * auVar53,8);
        uVar71 = SUB168(auVar21 * auVar53,0);
        uVar76 = uVar88 + uVar71;
        uVar71 = (ulong)CARRY8(uVar88,uVar71);
        uVar77 = uVar89 + uVar78;
        uVar90 = uVar77 + uVar71;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = uVar73;
        auVar54._8_8_ = 0;
        auVar54._0_8_ = local_50.d[1];
        uVar79 = SUB168(auVar22 * auVar54,8);
        uVar82 = SUB168(auVar22 * auVar54,0);
        uVar88 = uVar76 + uVar82;
        uVar82 = (ulong)CARRY8(uVar76,uVar82);
        uVar87 = uVar90 + uVar79;
        uVar91 = uVar87 + uVar82;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = uVar74;
        auVar55._8_8_ = 0;
        auVar55._0_8_ = local_50.d[0];
        uVar80 = SUB168(auVar23 * auVar55,8);
        uVar76 = SUB168(auVar23 * auVar55,0);
        local_1d8._16_8_ = uVar88 + uVar76;
        uVar76 = (ulong)CARRY8(uVar88,uVar76);
        uVar88 = uVar91 + uVar80;
        uVar92 = uVar88 + uVar76;
        uVar83 = (ulong)(CARRY8(uVar89,uVar78) || CARRY8(uVar77,uVar71)) +
                 (ulong)(CARRY8(uVar90,uVar79) || CARRY8(uVar87,uVar82)) +
                 (ulong)(CARRY8(uVar91,uVar80) || CARRY8(uVar88,uVar76));
        auVar24._8_8_ = 0;
        auVar24._0_8_ = uVar72;
        auVar56._8_8_ = 0;
        auVar56._0_8_ = local_50.d[3];
        uVar80 = SUB168(auVar24 * auVar56,8);
        uVar72 = SUB168(auVar24 * auVar56,0);
        uVar76 = uVar92 + uVar72;
        uVar71 = (ulong)CARRY8(uVar92,uVar72);
        uVar87 = uVar83 + uVar80;
        uVar92 = uVar87 + uVar71;
        uVar72 = r_00->d[3];
        auVar25._8_8_ = 0;
        auVar25._0_8_ = uVar73;
        auVar57._8_8_ = 0;
        auVar57._0_8_ = local_50.d[2];
        uVar89 = SUB168(auVar25 * auVar57,8);
        uVar82 = SUB168(auVar25 * auVar57,0);
        uVar77 = uVar76 + uVar82;
        uVar82 = (ulong)CARRY8(uVar76,uVar82);
        uVar88 = uVar92 + uVar89;
        uVar84 = uVar88 + uVar82;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = uVar74;
        auVar58._8_8_ = 0;
        auVar58._0_8_ = local_50.d[1];
        uVar90 = SUB168(auVar26 * auVar58,8);
        uVar76 = SUB168(auVar26 * auVar58,0);
        uVar79 = uVar77 + uVar76;
        uVar76 = (ulong)CARRY8(uVar77,uVar76);
        uVar78 = uVar84 + uVar90;
        uVar85 = uVar78 + uVar76;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = uVar72;
        auVar59._8_8_ = 0;
        auVar59._0_8_ = local_50.d[0];
        uVar91 = SUB168(auVar27 * auVar59,8);
        uVar77 = SUB168(auVar27 * auVar59,0);
        local_1d8._24_8_ = uVar79 + uVar77;
        uVar77 = (ulong)CARRY8(uVar79,uVar77);
        uVar79 = uVar85 + uVar91;
        uVar86 = uVar79 + uVar77;
        uVar80 = (ulong)(CARRY8(uVar83,uVar80) || CARRY8(uVar87,uVar71)) +
                 (ulong)(CARRY8(uVar92,uVar89) || CARRY8(uVar88,uVar82)) +
                 (ulong)(CARRY8(uVar84,uVar90) || CARRY8(uVar78,uVar76)) +
                 (ulong)(CARRY8(uVar85,uVar91) || CARRY8(uVar79,uVar77));
        auVar28._8_8_ = 0;
        auVar28._0_8_ = uVar73;
        auVar60._8_8_ = 0;
        auVar60._0_8_ = local_50.d[3];
        uVar88 = SUB168(auVar28 * auVar60,8);
        uVar73 = SUB168(auVar28 * auVar60,0);
        uVar82 = uVar86 + uVar73;
        uVar73 = (ulong)CARRY8(uVar86,uVar73);
        uVar76 = uVar80 + uVar88;
        uVar89 = uVar76 + uVar73;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = uVar74;
        auVar61._8_8_ = 0;
        auVar61._0_8_ = local_50.d[2];
        uVar78 = SUB168(auVar29 * auVar61,8);
        uVar71 = SUB168(auVar29 * auVar61,0);
        uVar87 = uVar82 + uVar71;
        uVar71 = (ulong)CARRY8(uVar82,uVar71);
        uVar77 = uVar89 + uVar78;
        uVar90 = uVar77 + uVar71;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = uVar72;
        auVar62._8_8_ = 0;
        auVar62._0_8_ = local_50.d[1];
        uVar79 = SUB168(auVar30 * auVar62,8);
        uVar82 = SUB168(auVar30 * auVar62,0);
        local_1d8._32_8_ = uVar87 + uVar82;
        uVar82 = (ulong)CARRY8(uVar87,uVar82);
        uVar87 = uVar90 + uVar79;
        uVar91 = uVar87 + uVar82;
        uVar87 = (ulong)(CARRY8(uVar80,uVar88) || CARRY8(uVar76,uVar73)) +
                 (ulong)(CARRY8(uVar89,uVar78) || CARRY8(uVar77,uVar71)) +
                 (ulong)(CARRY8(uVar90,uVar79) || CARRY8(uVar87,uVar82));
        auVar31._8_8_ = 0;
        auVar31._0_8_ = uVar74;
        auVar63._8_8_ = 0;
        auVar63._0_8_ = local_50.d[3];
        uVar76 = SUB168(auVar31 * auVar63,8);
        uVar73 = SUB168(auVar31 * auVar63,0);
        uVar82 = uVar91 + uVar73;
        uVar73 = (ulong)CARRY8(uVar91,uVar73);
        uVar71 = uVar87 + uVar76;
        uVar88 = uVar71 + uVar73;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = uVar72;
        auVar64._8_8_ = 0;
        auVar64._0_8_ = local_50.d[2];
        uVar77 = SUB168(auVar32 * auVar64,8);
        uVar74 = SUB168(auVar32 * auVar64,0);
        local_1d8._40_8_ = uVar82 + uVar74;
        uVar74 = (ulong)CARRY8(uVar82,uVar74);
        uVar82 = uVar88 + uVar77;
        auVar67._8_8_ =
             (ulong)(CARRY8(uVar87,uVar76) || CARRY8(uVar71,uVar73)) +
             (ulong)(CARRY8(uVar88,uVar77) || CARRY8(uVar82,uVar74));
        auVar67._0_8_ = uVar82 + uVar74;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = uVar72;
        auVar65._8_8_ = 0;
        auVar65._0_8_ = local_50.d[3];
        unique0x10000211 = auVar33 * auVar65 + auVar67;
        secp256k1_scalar_reduce_512(r_00,(uint64_t *)local_1d8);
        uVar93 = (uint)(r_00->d[3] >> 0x3f);
        uVar75 = uVar93 ^ 1;
        uVar81 = uVar75;
        if (r_00->d[2] == 0xffffffffffffffff) {
          uVar81 = 0;
        }
        if (0x5d576e7357a4501c < r_00->d[1]) {
          uVar75 = 0;
        }
        uVar75 = (uVar75 | uVar81 | r_00->d[3] < 0x7fffffffffffffff) ^ 1;
        uVar81 = 0;
        if (0xdfe92f46681b20a0 < r_00->d[0]) {
          uVar81 = uVar75;
        }
        if (0x5d576e7357a4501d < r_00->d[1]) {
          uVar81 = uVar75;
        }
        uVar81 = uVar81 | uVar93;
        secp256k1_scalar_cond_negate(r_00,uVar81);
        if (recid != (int *)0x0) {
          *recid = *recid ^ uVar81;
        }
        auVar96._0_4_ = -(uint)((int)local_248->d[2] == 0 && (int)local_248->d[0] == 0);
        auVar96._4_4_ =
             -(uint)(*(int *)((long)local_248->d + 0x14) == 0 &&
                    *(int *)((long)local_248->d + 4) == 0);
        auVar96._8_4_ = -(uint)((int)local_248->d[3] == 0 && (int)local_248->d[1] == 0);
        auVar96._12_4_ =
             -(uint)(*(int *)((long)local_248->d + 0x1c) == 0 &&
                    *(int *)((long)local_248->d + 0xc) == 0);
        iVar70 = movmskps((int)local_248,auVar96);
        s2c_opening = local_230;
        r = local_228;
        uVar93 = local_23c;
        if ((iVar70 != 0xf) &&
           ((local_228->d[3] != 0 || local_228->d[1] != 0) ||
            (local_228->d[2] != 0 || local_228->d[0] != 0))) {
          uVar81 = 1;
          break;
        }
      }
      uVar81 = 0;
      data_size = noncedata;
      iVar70 = (*local_220)(local_1f8,msg32,seckey,(uchar *)0x0,noncedata,uVar93);
      uVar93 = uVar93 + 1;
    } while (iVar70 != 0);
  }
  uVar93 = uVar81 & local_240 ^ 1;
  lVar1 = (ulong)uVar93 - 1;
  auVar95._8_4_ = (int)lVar1;
  auVar95._0_8_ = lVar1;
  auVar95._12_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar2 = *(undefined1 (*) [16])(r->d + 2);
  *(undefined1 (*) [16])r->d = *(undefined1 (*) [16])r->d & auVar95;
  *(undefined1 (*) [16])(r->d + 2) = auVar2 & auVar95;
  auVar2 = *(undefined1 (*) [16])(local_248->d + 2);
  *(undefined1 (*) [16])local_248->d = *(undefined1 (*) [16])local_248->d & auVar95;
  *(undefined1 (*) [16])(local_248->d + 2) = auVar2 & auVar95;
  if (recid != (int *)0x0) {
    *recid = uVar93 - 1 & *recid;
  }
  return uVar81 & local_240;
}

Assistant:

static int secp256k1_ecdsa_sign_inner(const secp256k1_context* ctx, secp256k1_scalar* r, secp256k1_scalar* s, int* recid, secp256k1_sha256* s2c_sha, secp256k1_ecdsa_s2c_opening *s2c_opening, const unsigned char* s2c_data32, const unsigned char *msg32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar sec, non, msg;
    int ret = 0;
    int is_sec_valid;
    unsigned char nonce32[32];
    unsigned int count = 0;
    /* Default initialization here is important so we won't pass uninit values to the cmov in the end */
    *r = secp256k1_scalar_zero;
    *s = secp256k1_scalar_zero;
    if (recid) {
        *recid = 0;
    }
    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_default;
    }
    /* sign-to-contract commitments only work with the default nonce function,
     * because we need to ensure that s2c_data is actually hashed into the nonce and
     * not just ignored. Otherwise an attacker can exfiltrate the secret key by
     * signing the same message thrice with different commitments. */
    VERIFY_CHECK(s2c_data32 == NULL || noncefp == secp256k1_nonce_function_default);

    /* Fail if the secret key is invalid. */
    is_sec_valid = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_one, !is_sec_valid);
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    while (1) {
        int is_nonce_valid;
        ret = !!noncefp(nonce32, msg32, seckey, NULL, (void*)noncedata, count);
        if (!ret) {
            break;
        }
        is_nonce_valid = secp256k1_scalar_set_b32_seckey(&non, nonce32);
        /* The nonce is still secret here, but it being invalid is is less likely than 1:2^255. */
        secp256k1_declassify(ctx, &is_nonce_valid, sizeof(is_nonce_valid));
        if (is_nonce_valid) {
            if (s2c_data32 != NULL) {
                secp256k1_gej nonce_pj;
                secp256k1_ge nonce_p;

                /* Compute original nonce commitment/pubkey */
                secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &nonce_pj, &non);
                secp256k1_ge_set_gej(&nonce_p, &nonce_pj);
                if (s2c_opening != NULL) {
                    secp256k1_ecdsa_s2c_opening_save(s2c_opening, &nonce_p);
                }

                /* Because the nonce is valid, the nonce point isn't the point
                 * at infinity and we can declassify that information to be able to
                 * serialize the point. */
                secp256k1_declassify(ctx, &nonce_p.infinity, sizeof(nonce_p.infinity));

                /* Tweak nonce with s2c commitment. */
                ret = secp256k1_ec_commit_seckey(&non, &nonce_p, s2c_sha, s2c_data32, 32);
                secp256k1_declassify(ctx, &ret, sizeof(ret)); /* may be secret that the tweak falied, but happens with negligible probability */
                if (!ret) {
                    break;
                }
            }

            ret = secp256k1_ecdsa_sig_sign(&ctx->ecmult_gen_ctx, r, s, &sec, &msg, &non, recid);
            /* The final signature is no longer a secret, nor is the fact that we were successful or not. */
            secp256k1_declassify(ctx, &ret, sizeof(ret));
            if (ret) {
                break;
            }
        }
        count++;
    }
    /* We don't want to declassify is_sec_valid and therefore the range of
     * seckey. As a result is_sec_valid is included in ret only after ret was
     * used as a branching variable. */
    ret &= is_sec_valid;
    memset(nonce32, 0, 32);
    secp256k1_scalar_clear(&msg);
    secp256k1_scalar_clear(&non);
    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_cmov(r, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_cmov(s, &secp256k1_scalar_zero, !ret);
    if (recid) {
        const int zero = 0;
        secp256k1_int_cmov(recid, &zero, !ret);
    }
    return ret;
}